

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O2

bool __thiscall t_swift_generator::field_is_optional(t_swift_generator *this,t_field *tfield)

{
  e_req eVar1;
  e_req eVar2;
  iterator iVar3;
  bool bVar4;
  allocator local_51;
  key_type local_50;
  
  eVar1 = tfield->req_;
  bVar4 = eVar1 == T_OPTIONAL;
  std::__cxx11::string::string((string *)&local_50,"swift.nullable",&local_51);
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(tfield->annotations_)._M_t,&local_50);
  if ((_Rb_tree_header *)iVar3._M_node == &(tfield->annotations_)._M_t._M_impl.super__Rb_tree_header
     ) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  else {
    eVar2 = tfield->req_;
    std::__cxx11::string::~string((string *)&local_50);
    bVar4 = eVar2 != T_REQUIRED || eVar1 == T_OPTIONAL;
  }
  if (this->gen_cocoa_ == true) {
    bVar4 = tfield->req_ == T_OPTIONAL;
  }
  return bVar4;
}

Assistant:

bool field_is_optional(t_field* tfield) {
    bool opt = tfield->get_req() == t_field::T_OPTIONAL;
    if (tfield->annotations_.find("swift.nullable") != tfield->annotations_.end() && tfield->get_req() != t_field::T_REQUIRED) {
      opt = true;
    }
    if (gen_cocoa_) { // Backwards compatibility, only if its actually "optional"
      opt = tfield->get_req() == t_field::T_OPTIONAL;
    }
    return opt;
  }